

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VertexMCMC.h
# Opt level: O0

Estimates * VertexMCMC(Estimates *__return_storage_ptr__,CGraph *cg,Parameters *params)

{
  size_type sVar1;
  size_type sVar2;
  double dVar3;
  VertexIdx v_00;
  reference pvVar4;
  long lVar5;
  EdgeIdx *pEVar6;
  EdgeIdx *pEVar7;
  byte bVar8;
  reference rVar9;
  iterator iVar10;
  _Bit_iterator __first;
  _Bit_iterator __first_00;
  _Bit_iterator __last;
  _Bit_iterator __last_00;
  EdgeIdx aEStack_5418 [625];
  vector<bool,_std::allocator<bool>_> *local_4090;
  difference_type local_4088;
  vector<bool,_std::allocator<bool>_> *local_4080;
  difference_type local_4078;
  double local_4070;
  CGraph *local_4068;
  pointer *local_4060;
  OrderedEdgeCollection *local_4058;
  _Bit_type local_4050;
  _Bit_type *local_4048;
  _Bit_type local_4040;
  _Bit_type *local_4038;
  _Bit_type local_4030;
  _Bit_type *local_4028;
  _Bit_type local_4020;
  _Bit_type *local_4018;
  _Bit_type local_4010;
  _Bit_type *local_4008;
  size_type local_4000;
  long local_3ff8;
  result_type local_3ff0;
  long local_3fe8;
  result_type local_3fe0;
  undefined1 local_3fd1;
  _Bit_type local_3fd0;
  _Bit_type *local_3fc8;
  _Bit_type local_3fc0;
  _Bit_type *local_3fb8;
  _Bit_type local_3fb0;
  _Bit_type *local_3fa8;
  EdgeIdx local_3fa0;
  long local_3f98;
  result_type local_3f90;
  EdgeIdx local_3f88;
  EdgeIdx *local_3f80;
  CGraph *local_3f78;
  VertexIdx local_3f70;
  EdgeIdx local_3f68;
  size_type local_3f60;
  allocator_type *local_3f58;
  size_type local_3f50;
  allocator_type *local_3f48;
  Parameters *local_3f40;
  Estimates *local_3f38;
  Estimates *local_3f30;
  size_t *local_3f28;
  result_type_conflict1 local_3f20;
  bool local_3f19;
  _Bit_type *local_3f18;
  uint local_3f10;
  _Bit_type *local_3f08;
  uint local_3f00;
  _Bit_type *local_3ef8;
  uint local_3ef0;
  _Bit_type *local_3ee8;
  uint local_3ee0;
  difference_type local_3ed8;
  VertexIdx vertices_seen;
  _Bit_type *local_3ec8;
  uint local_3ec0;
  _Bit_type *local_3eb8;
  uint local_3eb0;
  _Bit_type *local_3ea8;
  uint local_3ea0;
  _Bit_type *local_3e98;
  uint local_3e90;
  difference_type local_3e88;
  VertexIdx edges_seen;
  double triangleEstimate;
  double transitivity;
  VertexIdx deg;
  VertexIdx src;
  OrderedEdgeCollection local_3db8;
  undefined1 local_3d40 [8];
  Estimates degree_sum_sq_output;
  OrderedEdgeCollection randomEdgeCollection;
  double dStack_3ca0;
  int skip;
  double wedge_count;
  _Bit_type local_3c90;
  _Bit_reference local_3c88;
  _Bit_reference local_3c78;
  _Bit_reference local_3c68;
  _Bit_reference local_3c58;
  size_type local_3c48;
  EdgeIdx e;
  VertexIdx v;
  VertexIdx u;
  EdgeIdx random_nbor_edge_v;
  EdgeIdx random_nbor_edge_u;
  uniform_int_distribution<long> dist_nbor;
  bernoulli_distribution accpet_dist;
  double acceptance_prob;
  undefined1 auStack_3bf8 [7];
  bool accept;
  _Bit_type local_3bf0;
  _Bit_reference local_3be8;
  _Bit_reference local_3bd8;
  value_type local_3bc8;
  size_type local_3ba8;
  EdgeIdx random_nbor_edge;
  uniform_int_distribution<long> dist_parent_nbor;
  EdgeIdx wL;
  EdgeIdx local_2800;
  VertexIdx deg_of_child;
  VertexIdx deg_of_parent;
  VertexIdx child;
  VertexIdx parent;
  VertexIdx no_of_query;
  EdgeIdx count_tri;
  undefined1 local_27c8 [8];
  vector<bool,_std::allocator<bool>_> visited_edge_set;
  undefined1 local_2798 [8];
  vector<bool,_std::allocator<bool>_> visited_vertex_set;
  vector<OrderedEdge,_std::allocator<OrderedEdge>_> edge_list;
  undefined1 local_2748 [8];
  mt19937 mt;
  random_device rd;
  VertexIdx seed;
  EdgeIdx walk_length;
  EdgeIdx m;
  VertexIdx n;
  Parameters *params_local;
  CGraph *cg_local;
  
  bVar8 = 0;
  sVar1 = cg->nVertices;
  sVar2 = cg->nEdges;
  dVar3 = (double)params->walk_length;
  local_3f40 = params;
  local_3f38 = __return_storage_ptr__;
  local_3f30 = __return_storage_ptr__;
  pvVar4 = std::vector<long,_std::allocator<long>_>::operator[](&params->seed_vertices,0);
  v_00 = *pvVar4;
  local_3f28 = &mt._M_p;
  std::random_device::random_device((random_device *)local_3f28);
  local_3f20 = std::random_device::operator()((random_device *)local_3f28);
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine
            ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              *)local_2748,(ulong)local_3f20);
  std::vector<OrderedEdge,_std::allocator<OrderedEdge>_>::vector
            ((vector<OrderedEdge,_std::allocator<OrderedEdge>_> *)
             &visited_vertex_set.super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_end_of_storage);
  visited_edge_set.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage._7_1_ = 0;
  local_3f48 = (allocator_type *)
               ((long)&visited_edge_set.super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_end_of_storage + 6);
  local_3f50 = sVar1;
  std::allocator<bool>::allocator(local_3f48);
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)local_2798,local_3f50,
             (bool *)((long)&visited_edge_set.super__Bvector_base<std::allocator<bool>_>._M_impl.
                             super__Bvector_impl_data._M_end_of_storage + 7),local_3f48);
  std::allocator<bool>::~allocator
            ((allocator<bool> *)
             ((long)&visited_edge_set.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_end_of_storage + 6));
  count_tri._7_1_ = 0;
  local_3f58 = (allocator_type *)((long)&count_tri + 6);
  local_3f60 = sVar2;
  std::allocator<bool>::allocator(local_3f58);
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)local_27c8,local_3f60,
             (bool *)((long)&count_tri + 7),local_3f58);
  std::allocator<bool>::~allocator((allocator<bool> *)((long)&count_tri + 6));
  no_of_query = 0;
  parent = 0;
  child = v_00;
  local_3f68 = Escape::CGraph::degree(cg,v_00);
  deg_of_child = local_3f68;
  if (local_3f68 == 0) {
    local_3f80 = &wL;
    local_3f78 = cg;
    memcpy(local_3f80,local_2748,5000);
    pEVar6 = local_3f80;
    pEVar7 = aEStack_5418;
    for (lVar5 = 0x271; lVar5 != 0; lVar5 = lVar5 + -1) {
      *pEVar7 = *pEVar6;
      pEVar6 = pEVar6 + (ulong)bVar8 * -2 + 1;
      pEVar7 = pEVar7 + (ulong)bVar8 * -2 + 1;
    }
    local_3f70 = AlternateSeed(local_3f78);
    child = local_3f70;
  }
  for (dist_parent_nbor._M_param._M_b = 0; dist_parent_nbor._M_param._M_b < (long)dVar3;
      dist_parent_nbor._M_param._M_b = dist_parent_nbor._M_param._M_b + 1) {
    local_3f88 = Escape::CGraph::degree(cg,child);
    deg_of_child = local_3f88;
    std::uniform_int_distribution<long>::uniform_int_distribution
              ((uniform_int_distribution<long> *)&random_nbor_edge,0,local_3f88 + -1);
    local_3f98 = cg->offsets[child];
    local_3f90 = std::uniform_int_distribution<long>::operator()
                           ((uniform_int_distribution<long> *)&random_nbor_edge,
                            (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                             *)local_2748);
    local_3ba8 = local_3f98 + local_3f90;
    parent = parent + 1;
    deg_of_parent = cg->nbors[local_3ba8];
    local_3fa0 = Escape::CGraph::degree(cg,deg_of_parent);
    local_3bc8.u = child;
    local_3bc8.v = deg_of_parent;
    local_3bc8.index = local_3ba8;
    local_3bc8.degree = deg_of_child;
    local_2800 = local_3fa0;
    std::vector<OrderedEdge,_std::allocator<OrderedEdge>_>::push_back
              ((vector<OrderedEdge,_std::allocator<OrderedEdge>_> *)
               &visited_vertex_set.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_end_of_storage,&local_3bc8);
    rVar9 = std::vector<bool,_std::allocator<bool>_>::operator[]
                      ((vector<bool,_std::allocator<bool>_> *)local_2798,child);
    local_3fb0 = rVar9._M_mask;
    local_3fa8 = rVar9._M_p;
    local_3bd8._M_p = local_3fa8;
    local_3bd8._M_mask = local_3fb0;
    std::_Bit_reference::operator=(&local_3bd8,true);
    rVar9 = std::vector<bool,_std::allocator<bool>_>::operator[]
                      ((vector<bool,_std::allocator<bool>_> *)local_2798,deg_of_parent);
    local_3fc0 = rVar9._M_mask;
    local_3fb8 = rVar9._M_p;
    local_3be8._M_p = local_3fb8;
    local_3be8._M_mask = local_3fc0;
    std::_Bit_reference::operator=(&local_3be8,true);
    rVar9 = std::vector<bool,_std::allocator<bool>_>::operator[]
                      ((vector<bool,_std::allocator<bool>_> *)local_27c8,local_3ba8);
    local_3fd0 = rVar9._M_mask;
    local_3fc8 = rVar9._M_p;
    _auStack_3bf8 = local_3fc8;
    local_3bf0 = local_3fd0;
    std::_Bit_reference::operator=((_Bit_reference *)auStack_3bf8,true);
    if (deg_of_child == 1) {
      acceptance_prob._7_1_ = true;
    }
    else {
      std::bernoulli_distribution::bernoulli_distribution
                ((bernoulli_distribution *)&dist_nbor._M_param._M_b,
                 (double)(local_2800 + -1) / (double)(deg_of_child + -1));
      local_3fd1 = std::bernoulli_distribution::operator()
                             ((bernoulli_distribution *)&dist_nbor._M_param._M_b,
                              (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                               *)local_2748);
      acceptance_prob._7_1_ = (result_type_conflict2)local_3fd1;
    }
    if (acceptance_prob._7_1_ != false) {
      child = deg_of_parent;
      deg_of_child = local_2800;
    }
    std::uniform_int_distribution<long>::uniform_int_distribution
              ((uniform_int_distribution<long> *)&random_nbor_edge_u,0,deg_of_child + -1);
    local_3fe8 = cg->offsets[child];
    local_3fe0 = std::uniform_int_distribution<long>::operator()
                           ((uniform_int_distribution<long> *)&random_nbor_edge_u,
                            (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                             *)local_2748);
    random_nbor_edge_v = local_3fe8 + local_3fe0;
    local_3ff8 = cg->offsets[child];
    local_3ff0 = std::uniform_int_distribution<long>::operator()
                           ((uniform_int_distribution<long> *)&random_nbor_edge_u,
                            (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                             *)local_2748);
    u = local_3ff8 + local_3ff0;
    parent = parent + 2;
    v = cg->nbors[random_nbor_edge_v];
    e = cg->nbors[u];
    local_4000 = Escape::CGraph::getEdgeBinary(cg,v,e);
    parent = parent + 1;
    if ((v != e) && (local_4000 != 0xffffffffffffffff)) {
      no_of_query = no_of_query + 1;
    }
    local_3c48 = local_4000;
    rVar9 = std::vector<bool,_std::allocator<bool>_>::operator[]
                      ((vector<bool,_std::allocator<bool>_> *)local_2798,v);
    local_4010 = rVar9._M_mask;
    local_4008 = rVar9._M_p;
    local_3c58._M_p = local_4008;
    local_3c58._M_mask = local_4010;
    std::_Bit_reference::operator=(&local_3c58,true);
    rVar9 = std::vector<bool,_std::allocator<bool>_>::operator[]
                      ((vector<bool,_std::allocator<bool>_> *)local_2798,e);
    local_4020 = rVar9._M_mask;
    local_4018 = rVar9._M_p;
    local_3c68._M_p = local_4018;
    local_3c68._M_mask = local_4020;
    std::_Bit_reference::operator=(&local_3c68,true);
    rVar9 = std::vector<bool,_std::allocator<bool>_>::operator[]
                      ((vector<bool,_std::allocator<bool>_> *)local_27c8,random_nbor_edge_v);
    local_4030 = rVar9._M_mask;
    local_4028 = rVar9._M_p;
    local_3c78._M_p = local_4028;
    local_3c78._M_mask = local_4030;
    std::_Bit_reference::operator=(&local_3c78,true);
    rVar9 = std::vector<bool,_std::allocator<bool>_>::operator[]
                      ((vector<bool,_std::allocator<bool>_> *)local_27c8,u);
    local_4040 = rVar9._M_mask;
    local_4038 = rVar9._M_p;
    local_3c88._M_p = local_4038;
    local_3c88._M_mask = local_4040;
    std::_Bit_reference::operator=(&local_3c88,true);
    if (local_3c48 != 0xffffffffffffffff) {
      rVar9 = std::vector<bool,_std::allocator<bool>_>::operator[]
                        ((vector<bool,_std::allocator<bool>_> *)local_27c8,local_3c48);
      local_4050 = rVar9._M_mask;
      local_4048 = rVar9._M_p;
      wedge_count = (double)local_4048;
      local_3c90 = local_4050;
      std::_Bit_reference::operator=((_Bit_reference *)&wedge_count,true);
    }
  }
  dStack_3ca0 = 0.0;
  if ((local_3f40->normalization_count_available & 1U) == 0) {
    randomEdgeCollection.no_of_query._4_4_ = 0x19;
    local_4058 = &randomEdgeCollection;
    degree_sum_sq_output.query_complexity = dVar3;
    std::vector<OrderedEdge,_std::allocator<OrderedEdge>_>::vector
              ((vector<OrderedEdge,_std::allocator<OrderedEdge>_> *)local_4058,
               (vector<OrderedEdge,_std::allocator<OrderedEdge>_> *)
               &visited_vertex_set.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_end_of_storage);
    local_4060 = &randomEdgeCollection.edge_list.
                  super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
    std::vector<bool,_std::allocator<bool>_>::vector
              ((vector<bool,_std::allocator<bool>_> *)local_4060,
               (vector<bool,_std::allocator<bool>_> *)local_27c8);
    std::vector<bool,_std::allocator<bool>_>::vector
              ((vector<bool,_std::allocator<bool>_> *)
               &randomEdgeCollection.visited_edge_set.super__Bvector_base<std::allocator<bool>_>.
                _M_impl.super__Bvector_impl_data._M_end_of_storage,
               (vector<bool,_std::allocator<bool>_> *)local_2798);
    randomEdgeCollection.visited_vertex_set.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
    local_4068 = cg;
    OrderedEdgeCollection::OrderedEdgeCollection
              (&local_3db8,(OrderedEdgeCollection *)&degree_sum_sq_output.query_complexity);
    Parameters::Parameters((Parameters *)&src,local_3f40);
    DegreeSumSquare((Estimates *)local_3d40,local_4068,&local_3db8,(Parameters *)&src,
                    randomEdgeCollection.no_of_query._4_4_);
    Parameters::~Parameters((Parameters *)&src);
    OrderedEdgeCollection::~OrderedEdgeCollection(&local_3db8);
    dStack_3ca0 = (double)local_3d40;
    OrderedEdgeCollection::~OrderedEdgeCollection
              ((OrderedEdgeCollection *)&degree_sum_sq_output.query_complexity);
  }
  else {
    for (deg = 0; deg < (long)sVar1; deg = deg + 1) {
      local_4070 = (double)Escape::CGraph::degree(cg,deg);
      dStack_3ca0 = (double)((long)local_4070 * ((long)local_4070 + -1)) * 0.5 + dStack_3ca0;
      transitivity = local_4070;
    }
  }
  triangleEstimate = (double)no_of_query / (double)(long)dVar3;
  edges_seen = (VertexIdx)((triangleEstimate * dStack_3ca0) / 3.0);
  local_3f38->estimate = 0.0;
  local_3f38->fraction_of_vertices_seen = 1.0;
  local_3f38->fraction_of_edges_seen = 1.0;
  local_3f38->query_complexity = 1.0;
  local_3f38->estimate = (double)edges_seen;
  local_4080 = (vector<bool,_std::allocator<bool>_> *)local_27c8;
  iVar10 = std::vector<bool,_std::allocator<bool>_>::begin(local_4080);
  local_3ea8 = iVar10.super__Bit_iterator_base._M_p;
  local_3ea0 = iVar10.super__Bit_iterator_base._M_offset;
  local_3e98 = local_3ea8;
  local_3e90 = local_3ea0;
  iVar10 = std::vector<bool,_std::allocator<bool>_>::end(local_4080);
  local_3ec8 = iVar10.super__Bit_iterator_base._M_p;
  local_3ec0 = iVar10.super__Bit_iterator_base._M_offset;
  vertices_seen._7_1_ = 1;
  __first.super__Bit_iterator_base._M_offset = local_3e90;
  __first.super__Bit_iterator_base._M_p = local_3e98;
  __first.super__Bit_iterator_base._12_4_ = 0;
  __last.super__Bit_iterator_base._12_4_ = 0;
  __last.super__Bit_iterator_base._M_p =
       (_Bit_type *)SUB128(iVar10.super__Bit_iterator_base._0_12_,0);
  __last.super__Bit_iterator_base._M_offset = SUB124(iVar10.super__Bit_iterator_base._0_12_,8);
  local_3eb8 = local_3ec8;
  local_3eb0 = local_3ec0;
  local_4078 = std::count<std::_Bit_iterator,bool>
                         (__first,__last,(bool *)((long)&vertices_seen + 7));
  local_4090 = (vector<bool,_std::allocator<bool>_> *)local_2798;
  local_3e88 = local_4078;
  iVar10 = std::vector<bool,_std::allocator<bool>_>::begin(local_4090);
  local_3ef8 = iVar10.super__Bit_iterator_base._M_p;
  local_3ef0 = iVar10.super__Bit_iterator_base._M_offset;
  local_3ee8 = local_3ef8;
  local_3ee0 = local_3ef0;
  iVar10 = std::vector<bool,_std::allocator<bool>_>::end(local_4090);
  local_3f18 = iVar10.super__Bit_iterator_base._M_p;
  local_3f10 = iVar10.super__Bit_iterator_base._M_offset;
  local_3f19 = true;
  __first_00.super__Bit_iterator_base._M_offset = local_3ee0;
  __first_00.super__Bit_iterator_base._M_p = local_3ee8;
  __first_00.super__Bit_iterator_base._12_4_ = 0;
  __last_00.super__Bit_iterator_base._12_4_ = 0;
  __last_00.super__Bit_iterator_base._M_p =
       (_Bit_type *)SUB128(iVar10.super__Bit_iterator_base._0_12_,0);
  __last_00.super__Bit_iterator_base._M_offset = SUB124(iVar10.super__Bit_iterator_base._0_12_,8);
  local_3f08 = local_3f18;
  local_3f00 = local_3f10;
  local_4088 = std::count<std::_Bit_iterator,bool>(__first_00,__last_00,&local_3f19);
  local_3f38->fraction_of_vertices_seen = ((double)local_4088 * 100.0) / (double)(long)sVar1;
  local_3f38->fraction_of_edges_seen = ((double)local_3e88 * 100.0) / (double)(long)sVar2;
  local_3f38->query_complexity = ((double)parent * 100.0) / (double)(long)sVar2;
  local_3ed8 = local_4088;
  std::vector<bool,_std::allocator<bool>_>::~vector
            ((vector<bool,_std::allocator<bool>_> *)local_27c8);
  std::vector<bool,_std::allocator<bool>_>::~vector
            ((vector<bool,_std::allocator<bool>_> *)local_2798);
  std::vector<OrderedEdge,_std::allocator<OrderedEdge>_>::~vector
            ((vector<OrderedEdge,_std::allocator<OrderedEdge>_> *)
             &visited_vertex_set.super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_end_of_storage);
  std::random_device::~random_device((random_device *)&mt._M_p);
  return local_3f30;
}

Assistant:

Estimates VertexMCMC(CGraph *cg, Parameters params)
{
    /**
     * Setting of various input parameters for executing the algorithm
     */
    VertexIdx n = cg->nVertices;
    EdgeIdx m = cg->nEdges; // Note that m is double of the number of edges in the graph
    // VertexIdx seed_count = params.seed_count;  // Unused for now. Reserved for future use
    EdgeIdx walk_length = params.walk_length;
    VertexIdx seed = params.seed_vertices[0]; // We are working with only one seed vertex for this project

    /**
    * Set up random number generator
    * Using this random number generator initializize a PRNG: this PRNG is passed along to
    * draw an element from various distributions
    */
    std::random_device rd;
    std::mt19937 mt(rd());

    /**
     * Data structures for book-keeping and local variables
     */
    std::vector<OrderedEdge> edge_list;
    std::vector <bool > visited_vertex_set(n,false);
    std::vector <bool > visited_edge_set(m,false);
    EdgeIdx count_tri = 0; // This variable counts the number of times we find a triangle
    VertexIdx no_of_query = 0;  // Counts the number of query made by the algorithm
    VertexIdx parent, child,deg_of_parent, deg_of_child;

    /**
     * Algorithm
     */
    parent = seed;
    deg_of_parent = cg->degree(parent); // degree of parent vertex
    if (deg_of_parent == 0)  // If we are stuck with an isolate vertex, we change the seed
        parent = AlternateSeed(cg,mt);

    for (EdgeIdx wL = 0; wL < walk_length; wL++) {  // Perform a random walk of length walk_length from the seed vertex
        deg_of_parent = cg->degree(parent); // degree of parent vertex
        std::uniform_int_distribution<VertexIdx> dist_parent_nbor(0, deg_of_parent - 1);
        EdgeIdx random_nbor_edge = cg->offsets[parent] + dist_parent_nbor(mt); // TODO: check randomness. same seeding ok?
        no_of_query++; // One query to the uniform random neighbor oracle
        child = cg->nbors[random_nbor_edge]; // child is the potential next vertex on the random walk
        deg_of_child = cg->degree(child);// degree of the child vertex

        /**
         * Update data structures
         */
        edge_list.push_back(OrderedEdge{parent, child, random_nbor_edge, deg_of_parent}); // Note that we do not care of the ordering of the edge.
        visited_vertex_set[parent] = true;
        visited_vertex_set[child] = true;
        visited_edge_set[random_nbor_edge] = true;

        /**
         * Decide if to take the step or stay put at the same vertex
         */
        bool accept;
        double acceptance_prob;
        if (deg_of_parent == 1)
            accept = true;
        else {
            acceptance_prob = (deg_of_child - 1) * 1.0 / (deg_of_parent - 1);
            std::bernoulli_distribution accpet_dist(acceptance_prob);
            accept = accpet_dist(mt);
        }
        if (accept) {
            parent = child;
            deg_of_parent = deg_of_child;
        }

        /**
         * Sample two nodes from the the neighborhood of parent. Call them u and v. Check if they form a triangle
         */
        std::uniform_int_distribution<VertexIdx> dist_nbor(0, deg_of_parent - 1);
        EdgeIdx random_nbor_edge_u = cg->offsets[parent] + dist_nbor(mt); // TODO: check randomness. same seeding ok?
        EdgeIdx random_nbor_edge_v = cg->offsets[parent] + dist_nbor(mt);
        no_of_query = no_of_query + 2; // Two queries to the uniform random neighbor oracle
        VertexIdx u = cg->nbors[random_nbor_edge_u];
        VertexIdx v = cg->nbors[random_nbor_edge_v];
        EdgeIdx e = cg->getEdgeBinary(u,v);
        no_of_query++; // One query to the edge oracle
        if( u!=v && e != -1) {// parent,u,v forms a triangle
            count_tri++;
        }

        /**
         * Update data structures
         */
        visited_vertex_set[u] = true;
        visited_vertex_set[v] = true;
        visited_edge_set[random_nbor_edge_u] = true;
        visited_edge_set[random_nbor_edge_v] = true;
        if (e!= -1)
            visited_edge_set[e] =true;

    }

    /**
     * Estimate the number of wedge count. This will be used in the triangle estimation.
     */
    double wedge_count = 0;
    if (!params.normalization_count_available) {
        int skip = 25;
        OrderedEdgeCollection randomEdgeCollection = {walk_length, edge_list, visited_edge_set, visited_vertex_set};
        Estimates degree_sum_sq_output = DegreeSumSquare(cg, randomEdgeCollection, params, skip);
        wedge_count = degree_sum_sq_output.estimate;
    }
    else {
        for (VertexIdx src=0; src < n; src++) {
            VertexIdx deg = cg->degree(src);
            wedge_count += deg * (deg-1) * 0.5;
        }
    }

    double transitivity = 1.0*count_tri / walk_length;
    double triangleEstimate = transitivity * wedge_count / 3.0 ;

    /**
     * Populate the return structure
     */
    Estimates return_estimate = {};
    return_estimate.estimate = triangleEstimate;

    VertexIdx edges_seen = std::count(visited_edge_set.begin(),visited_edge_set.end(),true);
    VertexIdx vertices_seen = std::count(visited_vertex_set.begin(),visited_vertex_set.end(), true);

    return_estimate.fraction_of_vertices_seen = vertices_seen * 100.0 / n;
    return_estimate.fraction_of_edges_seen = edges_seen * 100.0 / m;
    return_estimate.query_complexity = no_of_query *100.0 /m;

    return return_estimate;
}